

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void CollectHistogram_C(uint8_t *ref,uint8_t *pred,int start_block,int end_block,VP8Histogram *histo
                       )

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  ushort uVar4;
  long lVar5;
  int distribution [32];
  int16_t out [16];
  
  distribution[0x1c] = 0;
  distribution[0x1d] = 0;
  distribution[0x1e] = 0;
  distribution[0x1f] = 0;
  distribution[0x18] = 0;
  distribution[0x19] = 0;
  distribution[0x1a] = 0;
  distribution[0x1b] = 0;
  distribution[0x14] = 0;
  distribution[0x15] = 0;
  distribution[0x16] = 0;
  distribution[0x17] = 0;
  distribution[0x10] = 0;
  distribution[0x11] = 0;
  distribution[0x12] = 0;
  distribution[0x13] = 0;
  distribution[0xc] = 0;
  distribution[0xd] = 0;
  distribution[0xe] = 0;
  distribution[0xf] = 0;
  distribution[8] = 0;
  distribution[9] = 0;
  distribution[10] = 0;
  distribution[0xb] = 0;
  distribution[4] = 0;
  distribution[5] = 0;
  distribution[6] = 0;
  distribution[7] = 0;
  distribution[0] = 0;
  distribution[1] = 0;
  distribution[2] = 0;
  distribution[3] = 0;
  for (lVar5 = (long)start_block; lVar5 < end_block; lVar5 = lVar5 + 1) {
    (*VP8FTransform)(ref + VP8DspScan[lVar5],pred + VP8DspScan[lVar5],out);
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      uVar1 = out[lVar2];
      uVar4 = -uVar1;
      if (0 < (short)uVar1) {
        uVar4 = uVar1;
      }
      uVar3 = (ulong)(uVar4 >> 3);
      if (0x1e < uVar4 >> 3) {
        uVar3 = 0x1f;
      }
      distribution[uVar3] = distribution[uVar3] + 1;
    }
  }
  VP8SetHistogramData(distribution,histo);
  return;
}

Assistant:

static void CollectHistogram_C(const uint8_t* ref, const uint8_t* pred,
                               int start_block, int end_block,
                               VP8Histogram* const histo) {
  int j;
  int distribution[MAX_COEFF_THRESH + 1] = { 0 };
  for (j = start_block; j < end_block; ++j) {
    int k;
    int16_t out[16];

    VP8FTransform(ref + VP8DspScan[j], pred + VP8DspScan[j], out);

    // Convert coefficients to bin.
    for (k = 0; k < 16; ++k) {
      const int v = abs(out[k]) >> 3;
      const int clipped_value = clip_max(v, MAX_COEFF_THRESH);
      ++distribution[clipped_value];
    }
  }
  VP8SetHistogramData(distribution, histo);
}